

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_generic_join_mcast.c
# Opt level: O2

int os_fd_generic_join_mcast_send
              (os_fd *sock,netaddr *multicast,os_interface *os_if,_Bool loop,uint8_t ttl,
              oonf_log_source log_src)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int *piVar6;
  char *pcVar7;
  uint *puVar8;
  undefined7 in_register_00000081;
  uint i;
  uint local_c4;
  char *local_c0;
  ulong local_b8;
  netaddr_str buf2;
  netaddr_str buf1;
  
  local_c4 = (uint)CONCAT71(in_register_00000081,ttl);
  if (multicast->_type == '\x02') {
    if ((log_global_mask[log_src] & 1) != 0) {
      local_c0 = os_if->name;
      pcVar4 = netaddr_to_prefixstring(&buf2,multicast,false);
      pcVar5 = netaddr_to_prefixstring(&buf1,os_if->if_v4,false);
      oonf_log(LOG_SEVERITY_DEBUG,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0x8e,
               (void *)0x0,0,"Socket on interface %s joining sending multicast %s (src %s)\n",
               local_c0,pcVar4,pcVar5);
    }
    iVar3 = setsockopt(sock->fd,0,0x20,os_if->if_v4,4);
    if (iVar3 < 0) {
      if ((log_global_mask[log_src] & 4) == 0) {
        return -1;
      }
      pcVar4 = netaddr_to_prefixstring(&buf2,multicast,false);
      pcVar5 = netaddr_to_prefixstring(&buf1,os_if->if_v4,false);
      puVar8 = (uint *)__errno_location();
      pcVar7 = strerror(*puVar8);
      uVar1 = *puVar8;
      iVar3 = 0x93;
LAB_001168a5:
      oonf_log(LOG_SEVERITY_WARN,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",iVar3,
               (void *)0x0,0,"Cannot set multicast %s on interface %s (src %s): %s (%d)\n",pcVar4,
               os_if->name,pcVar5,pcVar7,(ulong)uVar1);
      return -1;
    }
    i = (uint)loop;
    iVar3 = setsockopt(sock->fd,0,0x22,&i,4);
    if (iVar3 < 0) {
      if ((log_global_mask[log_src] & 4) != 0) {
        pcVar4 = "de";
        if (loop) {
          pcVar4 = "";
        }
        puVar8 = (uint *)__errno_location();
        pcVar5 = strerror(*puVar8);
        oonf_log(LOG_SEVERITY_WARN,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0x9a,
                 (void *)0x0,0,"Cannot %sactivate local loop of multicast interface: %s (%d)\n",
                 pcVar4,pcVar5,(ulong)*puVar8);
      }
      return -1;
    }
    i = 1;
    if (1 < (byte)local_c4) {
      i = local_c4 & 0xff;
    }
    iVar3 = setsockopt(sock->fd,0,0x21,&i,4);
    uVar1 = i;
    if (-1 < iVar3) {
      return 0;
    }
    if ((log_global_mask[log_src] & 4) == 0) {
      return -1;
    }
    piVar6 = __errno_location();
    pcVar4 = strerror(*piVar6);
    iVar3 = 0xa0;
  }
  else {
    if ((log_global_mask[log_src] & 1) != 0) {
      local_c0 = os_if->name;
      local_b8 = (ulong)os_if->index;
      pcVar4 = netaddr_to_prefixstring(&buf2,multicast,false);
      pcVar5 = netaddr_to_prefixstring(&buf1,os_if->if_linklocal_v6,false);
      oonf_log(LOG_SEVERITY_DEBUG,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0xa6,
               (void *)0x0,0,"Socket on interface %s (%d) joining sending multicast %s (src %s)\n",
               local_c0,local_b8,pcVar4,pcVar5);
    }
    iVar3 = setsockopt(sock->fd,0x29,0x11,&os_if->index,4);
    if (iVar3 < 0) {
      if ((log_global_mask[log_src] & 4) == 0) {
        return -1;
      }
      pcVar4 = netaddr_to_prefixstring(&buf2,multicast,false);
      pcVar5 = netaddr_to_prefixstring(&buf1,os_if->if_linklocal_v6,false);
      puVar8 = (uint *)__errno_location();
      pcVar7 = strerror(*puVar8);
      uVar1 = *puVar8;
      iVar3 = 0xab;
      goto LAB_001168a5;
    }
    i = (uint)loop;
    iVar3 = setsockopt(sock->fd,0x29,0x13,&i,4);
    if (iVar3 < 0) {
      if ((log_global_mask[log_src] & 4) == 0) {
        return -1;
      }
      puVar8 = (uint *)__errno_location();
      pcVar5 = strerror(*puVar8);
      pcVar4 = (char *)(ulong)*puVar8;
      pcVar7 = "Cannot deactivate local loop of multicast interface: %s (%d)\n";
      iVar3 = 0xb1;
      goto LAB_0011697b;
    }
    bVar2 = 1;
    if (1 < (byte)local_c4) {
      bVar2 = (byte)local_c4;
    }
    i = (uint)bVar2;
    iVar3 = setsockopt(sock->fd,0x29,0x12,&i,4);
    uVar1 = i;
    if (-1 < iVar3) {
      return 0;
    }
    if ((log_global_mask[log_src] & 4) == 0) {
      return -1;
    }
    piVar6 = __errno_location();
    pcVar4 = strerror(*piVar6);
    iVar3 = 0xb7;
  }
  pcVar5 = (char *)(ulong)uVar1;
  pcVar7 = "Cannot set multicast TTL to %u: %s (%d)";
LAB_0011697b:
  oonf_log(LOG_SEVERITY_WARN,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",iVar3,
           (void *)0x0,0,pcVar7,pcVar5,pcVar4);
  return -1;
}

Assistant:

int
os_fd_generic_join_mcast_send(struct os_fd *sock, const struct netaddr *multicast, const struct os_interface *os_if,
  bool loop, uint8_t ttl, enum oonf_log_source log_src __attribute__((unused))) {
  struct netaddr_str buf1, buf2;
  unsigned i;

  if (netaddr_get_address_family(multicast) == AF_INET) {
    OONF_DEBUG(log_src, "Socket on interface %s joining sending multicast %s (src %s)\n", os_if->name,
      netaddr_to_string(&buf2, multicast), netaddr_to_string(&buf1, os_if->if_v4));

    if (setsockopt(sock->fd, IPPROTO_IP, IP_MULTICAST_IF, netaddr_get_binptr(os_if->if_v4), 4) < 0) {
      OONF_WARN(log_src, "Cannot set multicast %s on interface %s (src %s): %s (%d)\n",
        netaddr_to_string(&buf2, multicast), os_if->name, netaddr_to_string(&buf1, os_if->if_v4), strerror(errno),
        errno);
      return -1;
    }

    i = loop ? 1 : 0;
    if (setsockopt(sock->fd, IPPROTO_IP, IP_MULTICAST_LOOP, (char *)&i, sizeof(i)) < 0) {
      OONF_WARN(log_src, "Cannot %sactivate local loop of multicast interface: %s (%d)\n", loop ? "" : "de",
        strerror(errno), errno);
      return -1;
    }

    i = ttl > 0 ? ttl : 1;
    if (setsockopt(sock->fd, IPPROTO_IP, IP_MULTICAST_TTL, &i, sizeof(i)) < 0) {
      OONF_WARN(log_src, "Cannot set multicast TTL to %u: %s (%d)", i, strerror(errno), errno);
      return -1;
    }
  }
  else {
    OONF_DEBUG(log_src, "Socket on interface %s (%d) joining sending multicast %s (src %s)\n", os_if->name,
      os_if->index, netaddr_to_string(&buf2, multicast), netaddr_to_string(&buf1, os_if->if_linklocal_v6));

    if (setsockopt(sock->fd, IPPROTO_IPV6, IPV6_MULTICAST_IF, &os_if->index, sizeof(os_if->index)) < 0) {
      OONF_WARN(log_src, "Cannot set multicast %s on interface %s (src %s): %s (%d)\n",
        netaddr_to_string(&buf2, multicast), os_if->name, netaddr_to_string(&buf1, os_if->if_linklocal_v6),
        strerror(errno), errno);
      return -1;
    }

    i = loop ? 1 : 0;
    if (setsockopt(sock->fd, IPPROTO_IPV6, IPV6_MULTICAST_LOOP, &i, sizeof(i)) < 0) {
      OONF_WARN(log_src, "Cannot deactivate local loop of multicast interface: %s (%d)\n", strerror(errno), errno);
      return -1;
    }

    i = ttl > 0 ? ttl : 1;
    if (setsockopt(sock->fd, IPPROTO_IPV6, IPV6_MULTICAST_HOPS, &i, sizeof(i)) < 0) {
      OONF_WARN(log_src, "Cannot set multicast TTL to %u: %s (%d)", i, strerror(errno), errno);
      return -1;
    }
  }
  return 0;
}